

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZEqnArray<std::complex<double>_>_>::Resize
          (TPZVec<TPZEqnArray<std::complex<double>_>_> *this,int64_t newsize,
          TPZEqnArray<std::complex<double>_> *object)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int64_t *piVar5;
  int64_t iVar6;
  TPZEqnArray<std::complex<double>_> *pTVar7;
  ulong uVar8;
  TPZEqnArray<std::complex<double>_> *pTVar9;
  long lVar10;
  long lVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  iVar6 = this->fNElements;
  if (iVar6 != newsize) {
    if (newsize == 0) {
      pTVar9 = (TPZEqnArray<std::complex<double>_> *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar8 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x51d0),8) == 0) {
        uVar8 = SUB168(auVar3 * ZEXT816(0x51d0),0) | 8;
      }
      piVar5 = (int64_t *)operator_new__(uVar8);
      *piVar5 = newsize;
      pTVar9 = (TPZEqnArray<std::complex<double>_> *)(piVar5 + 1);
      lVar10 = 0;
      pTVar7 = pTVar9;
      do {
        TPZEqnArray<std::complex<double>_>::TPZEqnArray(pTVar7);
        lVar10 = lVar10 + -0x51d0;
        pTVar7 = pTVar7 + 1;
      } while (newsize * -0x51d0 - lVar10 != 0);
      iVar6 = this->fNElements;
    }
    if (newsize <= iVar6) {
      iVar6 = newsize;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    else {
      lVar11 = 0;
      lVar10 = iVar6;
      do {
        pTVar7 = this->fStore;
        puVar1 = (undefined8 *)
                 ((long)(pTVar7->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar11 + -0x28);
        puVar2 = (undefined8 *)
                 ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar11 + -0x28);
        *puVar2 = *puVar1;
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
        TPZManVector<int,_100>::operator=
                  ((TPZManVector<int,_100> *)
                   ((long)(pTVar9->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar11 + -0x20),
                   (TPZManVector<int,_100> *)
                   ((long)(pTVar7->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                   lVar11 + -0x20));
        TPZManVector<std::complex<double>,_1000>::operator=
                  ((TPZManVector<std::complex<double>,_1000> *)
                   ((long)&(((TPZManVector<std::complex<double>,_1000> *)
                            ((pTVar9->fEqValues).super_TPZManVector<std::complex<double>,_1000>.
                             fExtAlloc + -2))->super_TPZVec<std::complex<double>_>)._vptr_TPZVec +
                   lVar11),(TPZManVector<std::complex<double>,_1000> *)
                           ((long)&(((TPZManVector<std::complex<double>,_1000> *)
                                    ((pTVar7->fEqValues).
                                     super_TPZManVector<std::complex<double>,_1000>.fExtAlloc + -2))
                                   ->super_TPZVec<std::complex<double>_>)._vptr_TPZVec + lVar11));
        TPZManVector<int,_1000>::operator=
                  ((TPZManVector<int,_1000> *)
                   ((long)(pTVar9->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar11 + -0x20)
                   ,(TPZManVector<int,_1000> *)
                    ((long)(pTVar7->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar11 + -0x20
                    ));
        *(undefined4 *)(puVar2 + 0xa39) = *(undefined4 *)(puVar1 + 0xa39);
        lVar11 = lVar11 + 0x51d0;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    lVar10 = newsize - iVar6;
    if (lVar10 != 0 && iVar6 <= newsize) {
      pTVar7 = pTVar9 + iVar6;
      do {
        iVar4 = object->fNumEq;
        pTVar7->fSymmetric = object->fSymmetric;
        pTVar7->fNumEq = iVar4;
        TPZManVector<int,_100>::operator=
                  (&(pTVar7->fEqStart).super_TPZManVector<int,_100>,
                   &(object->fEqStart).super_TPZManVector<int,_100>);
        TPZManVector<int,_100>::operator=
                  (&(pTVar7->fEqNumber).super_TPZManVector<int,_100>,
                   &(object->fEqNumber).super_TPZManVector<int,_100>);
        TPZManVector<std::complex<double>,_1000>::operator=
                  (&(pTVar7->fEqValues).super_TPZManVector<std::complex<double>,_1000>,
                   &(object->fEqValues).super_TPZManVector<std::complex<double>,_1000>);
        TPZManVector<int,_1000>::operator=
                  (&(pTVar7->fIndex).super_TPZManVector<int,_1000>,
                   &(object->fIndex).super_TPZManVector<int,_1000>);
        pTVar7->fLastTerm = object->fLastTerm;
        pTVar7 = pTVar7 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pTVar7 = this->fStore;
    if (pTVar7 != (TPZEqnArray<std::complex<double>_> *)0x0) {
      lVar10 = *(long *)&pTVar7[-1].fLastTerm;
      if (lVar10 != 0) {
        lVar11 = lVar10 * 0x51d0;
        do {
          TPZEqnArray<std::complex<double>_>::~TPZEqnArray
                    ((TPZEqnArray<std::complex<double>_> *)
                     ((long)pTVar7[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar11 + -0x28));
          lVar11 = lVar11 + -0x51d0;
        } while (lVar11 != 0);
      }
      operator_delete__(&pTVar7[-1].fLastTerm,lVar10 * 0x51d0 | 8);
      this->fStore = (TPZEqnArray<std::complex<double>_> *)0x0;
    }
    this->fStore = pTVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}